

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

StringList * __thiscall
Args::CmdLine::values(StringList *__return_storage_ptr__,CmdLine *this,String *name)

{
  int iVar1;
  ArgIface *pAVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ArgIface *__x;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pAVar2 = findArgument(this,name);
  if (pAVar2 == (ArgIface *)0x0) {
LAB_0011d646:
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar1 = (*pAVar2->_vptr_ArgIface[2])(pAVar2);
    if (iVar1 == 2) {
      iVar1 = (*pAVar2->_vptr_ArgIface[0x17])(pAVar2);
      __x = (ArgIface *)CONCAT44(extraout_var_00,iVar1);
    }
    else {
      if (iVar1 == 1) {
        iVar1 = (*pAVar2->_vptr_ArgIface[0x13])(pAVar2);
        std::__cxx11::string::string((string *)&local_30,(string *)CONCAT44(extraout_var,iVar1));
        __l._M_len = 1;
        __l._M_array = &local_30;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__,__l,&local_31);
        std::__cxx11::string::~string((string *)&local_30);
        return __return_storage_ptr__;
      }
      if (iVar1 != 0) goto LAB_0011d646;
      __x = pAVar2 + 0xd;
      if (pAVar2[0xb].m_cmdLine != (CmdLine *)pAVar2[0xc]._vptr_ArgIface) {
        __x = (ArgIface *)&pAVar2[0xb].m_cmdLine;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__x);
  }
  return __return_storage_ptr__;
}

Assistant:

StringList values(
		//! Name of the argument. Should be full name, i.e '-a' or '--arg'
		//! or 'add' if it's a command or subcommand.
		const String & name ) const
	{
		const auto * arg = findArgument( name );

		if( arg )
		{
			switch( arg->type() )
			{
				case ArgType::Command :
					return ( static_cast< const Command* > ( arg )->values() );

				case ArgType::Arg :
					return StringList(
						{ ( static_cast< const Arg* > ( arg )->value() ) } );

				case ArgType::MultiArg :
					return ( static_cast< const MultiArg* > ( arg )->values() );

				default :
					return StringList();
			}
		}
		else
			return StringList();
	}